

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshifter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_176c39::PshifterState::process
          (PshifterState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  FloatBufferLine *pFVar1;
  array<std::complex<double>,_1024UL> *paVar2;
  undefined8 *puVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  ulong *puVar10;
  int iVar11;
  size_t k;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  array<std::complex<double>,_1024UL> *__z;
  double dVar18;
  span<std::complex<double>,_18446744073709551615UL> buffer;
  span<std::complex<double>,_18446744073709551615UL> buffer_00;
  span<const_float,_18446744073709551615UL> sVar19;
  double local_40;
  double local_38;
  
  pFVar1 = &this->mBufferOut;
  paVar2 = &this->mFftBuffer;
  uVar12 = 0;
  while (uVar8 = samplesToDo - uVar12, uVar12 <= samplesToDo && uVar8 != 0) {
    uVar17 = 0x400 - this->mCount;
    if (uVar8 <= uVar17) {
      uVar17 = uVar8;
    }
    pdVar14 = (this->mFIFO)._M_elems + this->mCount;
    pfVar9 = pFVar1->_M_elems + uVar12;
    for (lVar13 = 0; uVar17 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
      *pfVar9 = (float)*(double *)((long)pdVar14 + lVar13);
      pfVar9 = pfVar9 + 1;
    }
    std::copy_n<float_const*,unsigned_long,double*>
              ((samplesIn.mData)->_M_elems + uVar12,uVar17,pdVar14);
    uVar8 = this->mCount + uVar17;
    this->mCount = uVar8;
    if (uVar8 < 0x400) break;
    uVar12 = uVar12 + uVar17;
    this->mCount = 0x300;
    for (lVar13 = 0; lVar13 != 0x2000; lVar13 = lVar13 + 8) {
      *(double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar13 * 2) =
           *(double *)((long)(this->mFIFO)._M_elems + lVar13) *
           *(double *)((long)&(anonymous_namespace)::HannWindow + lVar13);
      *(undefined8 *)((this->mFftBuffer)._M_elems[0]._M_value + lVar13 * 2 + 8) = 0;
    }
    buffer.mDataEnd = (pointer)&this->mAnalysisBuffer;
    buffer.mData = paVar2->_M_elems;
    forward_fft(buffer);
    __z = paVar2;
    for (lVar13 = 0; lVar13 != 0x201; lVar13 = lVar13 + 1) {
      dVar5 = std::abs<double>(__z->_M_elems);
      dVar6 = std::arg<double>(__z->_M_elems);
      dVar18 = (dVar6 - (this->mLastPhase)._M_elems[lVar13]) - (double)lVar13 * 1.5707963267948966;
      iVar11 = (int)(dVar18 / 3.141592653589793);
      ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)(__z + 1))->_M_elems[0].Amplitude =
           dVar5;
      ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)(__z + 1))->_M_elems[0].FreqBin =
           ((double)(iVar11 % 2 + iVar11) * -3.141592653589793 + dVar18) / 1.5707963267948966 +
           (double)lVar13;
      (this->mLastPhase)._M_elems[lVar13] = dVar6;
      __z = (array<std::complex<double>,_1024UL> *)(__z->_M_elems + 1);
    }
    for (lVar13 = -0x2010; lVar13 != 0; lVar13 = lVar13 + 0x10) {
      puVar3 = (undefined8 *)((long)(this->mBufferOut)._M_elems + lVar13 + -8);
      *puVar3 = 0;
      puVar3[1] = 0;
    }
    uVar4 = this->mPitchShiftI;
    uVar7 = (uint)(0x2007ff / (ulong)uVar4);
    if (0x1ff < uVar7) {
      uVar7 = 0x200;
    }
    dVar5 = this->mPitchShift;
    uVar8 = 0x800;
    pdVar14 = &(this->mAnalysisBuffer)._M_elems[0].FreqBin;
    for (uVar17 = 0; uVar17 < uVar7 + 1; uVar17 = uVar17 + 1) {
      uVar15 = uVar8 >> 8 & 0xfffffffffffffff0;
      *(double *)((long)&(this->mSynthesisBuffer)._M_elems[0].Amplitude + uVar15) =
           ((FrequencyBin *)(pdVar14 + -1))->Amplitude +
           *(double *)((long)&(this->mSynthesisBuffer)._M_elems[0].Amplitude + uVar15);
      *(double *)((long)&(this->mSynthesisBuffer)._M_elems[0].FreqBin + uVar15) = *pdVar14 * dVar5;
      pdVar14 = pdVar14 + 2;
      uVar8 = uVar8 + uVar4;
    }
    for (lVar13 = 0x3024; lVar13 != 0x402c; lVar13 = lVar13 + 8) {
      dVar5 = *(double *)((long)((this->mFftBuffer)._M_elems + -3) + lVar13 * 2) *
              1.5707963267948966 + *(double *)((long)(this->mFIFO)._M_elems + lVar13 + -0x1c);
      *(double *)((long)(this->mFIFO)._M_elems + lVar13 + -0x1c) = dVar5;
      sincos(dVar5,&local_38,&local_40);
      dVar5 = *(double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar13 * 2 + -0x38);
      pdVar14 = (double *)((long)(this->mFIFO)._M_elems + lVar13 * 2 + -0x38);
      *pdVar14 = local_40 * dVar5;
      pdVar14[1] = local_38 * dVar5;
    }
    puVar10 = (ulong *)((this->mFftBuffer)._M_elems[0x201]._M_value + 8);
    for (lVar13 = 0; lVar13 != -0x1ff0; lVar13 = lVar13 + -0x10) {
      uVar8 = *(ulong *)((this->mFftBuffer)._M_elems[0x1ff]._M_value + lVar13 + 8);
      *(undefined8 *)((complex<double> *)(puVar10 + -1))->_M_value =
           *(undefined8 *)((this->mFftBuffer)._M_elems[0x1ff]._M_value + lVar13);
      *puVar10 = uVar8 ^ 0x8000000000000000;
      puVar10 = puVar10 + 2;
    }
    buffer_00.mDataEnd = (pointer)&this->mAnalysisBuffer;
    buffer_00.mData = paVar2->_M_elems;
    inverse_fft(buffer_00);
    for (lVar13 = 0; lVar13 != 0x2000; lVar13 = lVar13 + 8) {
      *(double *)((long)(this->mOutputAccum)._M_elems + lVar13) =
           *(double *)((long)&(anonymous_namespace)::HannWindow + lVar13) *
           *(double *)(paVar2->_M_elems[0]._M_value + lVar13 * 2) * 0.0009765625 +
           *(double *)((long)(this->mOutputAccum)._M_elems + lVar13);
    }
    memmove(&this->mFIFO,(this->mFIFO)._M_elems + 0x100,0x1800);
    memcpy((this->mFIFO)._M_elems + 0x300,&this->mOutputAccum,0x800);
    memmove(&this->mOutputAccum,(this->mOutputAccum)._M_elems + 0x100,0x1800);
    for (lVar13 = 0; lVar13 != 0x800; lVar13 = lVar13 + 8) {
      *(undefined8 *)((long)(this->mOutputAccum)._M_elems + lVar13 + 0x1800) = 0;
    }
  }
  sVar16 = 0x200;
  if (0x200 < samplesToDo) {
    sVar16 = samplesToDo;
  }
  sVar19.mDataEnd = pFVar1->_M_elems + samplesToDo;
  sVar19.mData = pFVar1->_M_elems;
  (*MixSamples)(sVar19,samplesOut,this->mCurrentGains,this->mTargetGains,sVar16,0);
  return;
}

Assistant:

void PshifterState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    /* Pitch shifter engine based on the work of Stephan Bernsee.
     * http://blogs.zynaptiq.com/bernsee/pitch-shifting-using-the-ft/
     */

    /* Cycle offset per update expected of each frequency bin (bin 0 is none,
     * bin 1 is x1, bin 2 is x2, etc).
     */
    constexpr double expected_cycles{al::MathDefs<double>::Tau() / OVERSAMP};

    for(size_t base{0u};base < samplesToDo;)
    {
        const size_t todo{minz(STFT_SIZE-mCount, samplesToDo-base)};

        /* Retrieve the output samples from the FIFO and fill in the new input
         * samples.
         */
        auto fifo_iter = mFIFO.begin() + mCount;
        std::transform(fifo_iter, fifo_iter+todo, mBufferOut.begin()+base,
            [](double d) noexcept -> float { return static_cast<float>(d); });

        std::copy_n(samplesIn[0].begin()+base, todo, fifo_iter);
        mCount += todo;
        base += todo;

        /* Check whether FIFO buffer is filled with new samples. */
        if(mCount < STFT_SIZE) break;
        mCount = FIFO_LATENCY;

        /* Time-domain signal windowing, store in FftBuffer, and apply a
         * forward FFT to get the frequency-domain signal.
         */
        for(size_t k{0u};k < STFT_SIZE;k++)
            mFftBuffer[k] = mFIFO[k] * HannWindow[k];
        forward_fft(mFftBuffer);

        /* Analyze the obtained data. Since the real FFT is symmetric, only
         * STFT_HALF_SIZE+1 samples are needed.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            const double amplitude{std::abs(mFftBuffer[k])};
            const double phase{std::arg(mFftBuffer[k])};

            /* Compute phase difference and subtract expected phase difference */
            double tmp{(phase - mLastPhase[k]) - static_cast<double>(k)*expected_cycles};

            /* Map delta phase into +/- Pi interval */
            int qpd{double2int(tmp / al::MathDefs<double>::Pi())};
            tmp -= al::MathDefs<double>::Pi() * (qpd + (qpd%2));

            /* Get deviation from bin frequency from the +/- Pi interval */
            tmp /= expected_cycles;

            /* Compute the k-th partials' true frequency and store the
             * amplitude and frequency bin in the analysis buffer.
             */
            mAnalysisBuffer[k].Amplitude = amplitude;
            mAnalysisBuffer[k].FreqBin = static_cast<double>(k) + tmp;

            /* Store the actual phase[k] for the next frame. */
            mLastPhase[k] = phase;
        }

        /* Shift the frequency bins according to the pitch adjustment,
         * accumulating the amplitudes of overlapping frequency bins.
         */
        std::fill(mSynthesisBuffer.begin(), mSynthesisBuffer.end(), FrequencyBin{});
        const size_t bin_count{minz(STFT_HALF_SIZE+1,
            (((STFT_HALF_SIZE+1)<<MixerFracBits) - (MixerFracOne>>1) - 1)/mPitchShiftI + 1)};
        for(size_t k{0u};k < bin_count;k++)
        {
            const size_t j{(k*mPitchShiftI + (MixerFracOne>>1)) >> MixerFracBits};
            mSynthesisBuffer[j].Amplitude += mAnalysisBuffer[k].Amplitude;
            mSynthesisBuffer[j].FreqBin    = mAnalysisBuffer[k].FreqBin * mPitchShift;
        }

        /* Reconstruct the frequency-domain signal from the adjusted frequency
         * bins.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            /* Calculate actual delta phase and accumulate it to get bin phase */
            mSumPhase[k] += mSynthesisBuffer[k].FreqBin * expected_cycles;

            mFftBuffer[k] = std::polar(mSynthesisBuffer[k].Amplitude, mSumPhase[k]);
        }
        for(size_t k{STFT_HALF_SIZE+1};k < STFT_SIZE;++k)
            mFftBuffer[k] = std::conj(mFftBuffer[STFT_SIZE-k]);

        /* Apply an inverse FFT to get the time-domain siganl, and accumulate
         * for the output with windowing.
         */
        inverse_fft(mFftBuffer);
        for(size_t k{0u};k < STFT_SIZE;k++)
            mOutputAccum[k] += HannWindow[k]*mFftBuffer[k].real() * (4.0/OVERSAMP/STFT_SIZE);

        /* Shift FIFO and accumulator. */
        fifo_iter = std::copy(mFIFO.begin()+STFT_STEP, mFIFO.end(), mFIFO.begin());
        std::copy_n(mOutputAccum.begin(), STFT_STEP, fifo_iter);
        auto accum_iter = std::copy(mOutputAccum.begin()+STFT_STEP, mOutputAccum.end(),
            mOutputAccum.begin());
        std::fill(accum_iter, mOutputAccum.end(), 0.0);
    }

    /* Now, mix the processed sound data to the output. */
    MixSamples({mBufferOut.data(), samplesToDo}, samplesOut, mCurrentGains, mTargetGains,
        maxz(samplesToDo, 512), 0);
}